

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_writer_factory.cc
# Opt level: O1

bool draco::FileWriterFactory::RegisterWriter(OpenFunction open_function)

{
  iterator __position;
  long lVar1;
  vector<std::unique_ptr<draco::FileWriterInterface,std::default_delete<draco::FileWriterInterface>>(*)(std::__cxx11::string_const&),std::allocator<std::unique_ptr<draco::FileWriterInterface,std::default_delete<draco::FileWriterInterface>>(*)(std::__cxx11::string_const&)>>
  *this;
  _func_unique_ptr<draco::FileWriterInterface,_std::default_delete<draco::FileWriterInterface>_>_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ptr
  *in_RDI;
  bool bVar2;
  _func_unique_ptr<draco::FileWriterInterface,_std::default_delete<draco::FileWriterInterface>_>_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ptr
  *local_18;
  
  if (in_RDI == (_func_unique_ptr<draco::FileWriterInterface,_std::default_delete<draco::FileWriterInterface>_>_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ptr
                 *)0x0) {
    bVar2 = false;
  }
  else {
    local_18 = in_RDI;
    this = (vector<std::unique_ptr<draco::FileWriterInterface,std::default_delete<draco::FileWriterInterface>>(*)(std::__cxx11::string_const&),std::allocator<std::unique_ptr<draco::FileWriterInterface,std::default_delete<draco::FileWriterInterface>>(*)(std::__cxx11::string_const&)>>
            *)(anonymous_namespace)::GetFileWriterOpenFunctions_abi_cxx11_();
    __position._M_current =
         *(_func_unique_ptr<draco::FileWriterInterface,_std::default_delete<draco::FileWriterInterface>_>_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ptr
           ***)(this + 8);
    lVar1 = *(long *)this;
    if (__position._M_current ==
        *(_func_unique_ptr<draco::FileWriterInterface,_std::default_delete<draco::FileWriterInterface>_>_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ptr
          ***)(this + 0x10)) {
      std::
      vector<std::unique_ptr<draco::FileWriterInterface,std::default_delete<draco::FileWriterInterface>>(*)(std::__cxx11::string_const&),std::allocator<std::unique_ptr<draco::FileWriterInterface,std::default_delete<draco::FileWriterInterface>>(*)(std::__cxx11::string_const&)>>
      ::
      _M_realloc_insert<std::unique_ptr<draco::FileWriterInterface,std::default_delete<draco::FileWriterInterface>>(*const&)(std::__cxx11::string_const&)>
                (this,__position,&local_18);
    }
    else {
      *__position._M_current = local_18;
      *(long *)(this + 8) = *(long *)(this + 8) + 8;
    }
    bVar2 = *(long *)(this + 8) - *(long *)this >> 3 ==
            ((long)__position._M_current - lVar1 >> 3) + 1;
  }
  return bVar2;
}

Assistant:

bool FileWriterFactory::RegisterWriter(OpenFunction open_function) {
  if (open_function == nullptr) {
    return false;
  }
  auto open_functions = GetFileWriterOpenFunctions();
  const size_t num_writers = open_functions->size();
  open_functions->push_back(open_function);
  return open_functions->size() == num_writers + 1;
}